

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleConfigLoader.cpp
# Opt level: O3

bool __thiscall
SimpleConfigLoader::string2bool(SimpleConfigLoader *this,string *stringValue,bool *boolValue)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  bool bVar4;
  size_type sVar5;
  
  sVar1 = stringValue->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (stringValue->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      iVar3 = tolower((int)pcVar2[sVar5]);
      pcVar2[sVar5] = (char)iVar3;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  iVar3 = std::__cxx11::string::compare((char *)stringValue);
  bVar4 = true;
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)stringValue);
    bVar4 = false;
    if (iVar3 != 0) {
      return false;
    }
  }
  *boolValue = bVar4;
  return true;
}

Assistant:

bool SimpleConfigLoader::string2bool(std::string stringValue, bool* boolValue)
{
	// Convert to lowercase
	std::transform(stringValue.begin(), stringValue.end(), stringValue.begin(), tolower);

	if (stringValue.compare("true") == 0)
	{
		*boolValue = true;
		return true;
	}

	if (stringValue.compare("false") == 0)
	{
		*boolValue = false;
		return true;
	}

	return false;
}